

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChContactSurfaceMesh.cpp
# Opt level: O1

ChVector<double> * __thiscall
chrono::fea::ChContactTriangleXYZROT::GetContactPointSpeed
          (ChVector<double> *__return_storage_ptr__,ChContactTriangleXYZROT *this,
          ChVector<double> *abs_point)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  element_type *peVar10;
  element_type *peVar11;
  double dVar12;
  bool is_into;
  double s3;
  double s2;
  undefined1 local_58 [16];
  double local_48;
  ChVector<double> local_38;
  
  local_38.m_data[0] = abs_point->m_data[0];
  local_38.m_data[1] = abs_point->m_data[1];
  local_38.m_data[2] = abs_point->m_data[2];
  local_58 = ZEXT816(0) << 0x20;
  local_48 = 0.0;
  collision::utils::PointTriangleDistance
            (&local_38,
             (ChVector<double> *)
             &(((this->mnode1).
                super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
              ->super_ChNodeFEAbase).field_0x20,
             (ChVector<double> *)
             &(((this->mnode2).
                super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
              ->super_ChNodeFEAbase).field_0x20,
             (ChVector<double> *)
             &(((this->mnode3).
                super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
              ->super_ChNodeFEAbase).field_0x20,&s2,&s3,&is_into,(ChVector<double> *)local_58);
  dVar12 = (1.0 - s2) - s3;
  peVar10 = (this->mnode1).
            super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  peVar11 = (this->mnode2).
            super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  dVar1 = *(double *)&peVar10->field_0xa0;
  dVar2 = *(double *)&peVar10->field_0xa8;
  dVar3 = *(double *)&peVar10->field_0xb0;
  dVar4 = *(double *)&peVar11->field_0xa0;
  dVar5 = *(double *)&peVar11->field_0xa8;
  dVar6 = *(double *)&peVar11->field_0xb0;
  peVar10 = (this->mnode3).
            super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  dVar7 = *(double *)&peVar10->field_0xa0;
  dVar8 = *(double *)&peVar10->field_0xa8;
  dVar9 = *(double *)&peVar10->field_0xb0;
  __return_storage_ptr__->m_data[0] = 0.0;
  __return_storage_ptr__->m_data[1] = 0.0;
  __return_storage_ptr__->m_data[0] = dVar12 * dVar1 + s2 * dVar4 + s3 * dVar7;
  __return_storage_ptr__->m_data[1] = dVar12 * dVar2 + s2 * dVar5 + s3 * dVar8;
  __return_storage_ptr__->m_data[2] = dVar12 * dVar3 + s2 * dVar6 + s3 * dVar9;
  return __return_storage_ptr__;
}

Assistant:

ChVector<> ChContactTriangleXYZROT::GetContactPointSpeed(const ChVector<>& abs_point) {
    double s2, s3;
    ComputeUVfromP(abs_point, s2, s3);
    double s1 = 1 - s2 - s3;
    return (s1 * mnode1->GetPos_dt() + s2 * mnode2->GetPos_dt() + s3 * mnode3->GetPos_dt());
}